

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O2

void __thiscall
amrex::MLCellLinOp::BndryCondLoc::setLOBndryConds
          (BndryCondLoc *this,Geometry *geom,Real *dx,
          Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
          *lobc,Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                *hibc,int ratio,RealVect *interior_bloc,Array<Real,_3> *domain_bloc_lo,
          Array<Real,_3> *domain_bloc_hi)

{
  pointer pVVar1;
  pointer pVVar2;
  int *piVar3;
  int *piVar4;
  int icomp_1;
  long lVar5;
  long lVar6;
  long lVar7;
  int icomp;
  long lVar8;
  PinnedVector<GpuArray<BCTL,_2_*_3>_> hv;
  MFIter mfi;
  GpuArray<amrex::MLCellLinOp::BCTL,_6U> tmp;
  
  MFIter::MFIter(&mfi,&(this->bcloc).super_FabArrayBase,'\0');
  while (mfi.currentIndex < mfi.endIndex) {
    MFIter::validbox((Box *)&tmp,&mfi);
    lVar5 = 0;
    lVar6 = 0;
    lVar7 = 0;
    for (lVar8 = 0; lVar8 < this->m_ncomp; lVar8 = lVar8 + 1) {
      piVar3 = &mfi.currentIndex;
      if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar3 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + mfi.currentIndex;
      }
      piVar4 = &mfi.currentIndex;
      if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar4 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + mfi.currentIndex;
      }
      hv.m_data = (pointer)((ulong)(byte)(geom->super_CoordSys).field_0x52 << 0x20 |
                           (ulong)(byte)(geom->super_CoordSys).field_0x51);
      hv.m_size = CONCAT44(hv.m_size._4_4_,(uint)(byte)(geom->super_CoordSys).field_0x53);
      MLMGBndry::setBoxBC((RealTuple *)
                          (*(long *)&(this->bcloc).m_data.
                                     super_vector<amrex::Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>_>_>
                                     .
                                     super__Vector_base<amrex::Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[*piVar3].
                                     super_vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>
                                     .
                                     super__Vector_base<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>
                          + lVar7),(BCTuple *)
                                   (*(long *)&(this->bcond).m_data.
                                              super_vector<amrex::Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>_>_>
                                              .
                                              super__Vector_base<amrex::Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[*piVar4].
                                              super_vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>
                                              .
                                              super__Vector_base<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>
                                   + lVar6),(Box *)&tmp,&geom->domain,
                          (Array<LinOpBCType,_3> *)
                          ((long)((lobc->
                                  super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                                  ).
                                  super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar5),
                          (Array<LinOpBCType,_3> *)
                          ((long)((hibc->
                                  super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                                  ).
                                  super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar5),dx,
                          ratio,interior_bloc,domain_bloc_lo,domain_bloc_hi,(GpuArray<int,_3U> *)&hv
                         );
      lVar7 = lVar7 + 0x30;
      lVar6 = lVar6 + 0x18;
      lVar5 = lVar5 + 0xc;
    }
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  hv.m_data = (pointer)0x0;
  hv.m_size = 0;
  hv.m_capacity = 0;
  PODVector<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>,_std::allocator<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_>_>
  ::reserve(&hv,(this->bctl_dv).m_size);
  MFIter::MFIter(&mfi,&(this->bctl).super_FabArrayBase,'\0');
  while (mfi.currentIndex < mfi.endIndex) {
    lVar6 = 0;
    for (lVar5 = 0; lVar5 < this->m_ncomp; lVar5 = lVar5 + 1) {
      GpuArray<amrex::MLCellLinOp::BCTL,_6U>::GpuArray(&tmp);
      pVVar1 = (this->bcond).m_data.
               super_vector<amrex::Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>_>_>
               .
               super__Vector_base<amrex::Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pVVar2 = (this->bcloc).m_data.
               super_vector<amrex::Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>_>_>
               .
               super__Vector_base<amrex::Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar6;
      for (lVar7 = 8; lVar7 != 0x68; lVar7 = lVar7 + 0x10) {
        piVar3 = &mfi.currentIndex;
        if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar3 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start + mfi.currentIndex;
        }
        *(undefined4 *)((long)(&mfi.tile_size + 6) + lVar7) =
             *(undefined4 *)
              (*(long *)&pVVar1[*piVar3].
                         super_vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>
                         .
                         super__Vector_base<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>
              + lVar8);
        piVar3 = &mfi.currentIndex;
        if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar3 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start + mfi.currentIndex;
        }
        *(undefined8 *)((long)&tmp.arr[0].type.bctype + lVar7) =
             *(undefined8 *)
              (*(long *)&pVVar2[*piVar3].
                         super_vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>
                         .
                         super__Vector_base<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>
              + lVar8 * 2);
        lVar8 = lVar8 + 4;
      }
      PODVector<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>,_std::allocator<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_>_>
      ::push_back(&hv,&tmp);
      lVar6 = lVar6 + 0x18;
    }
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  if (hv.m_size != 0) {
    memcpy((this->bctl_dv).m_data,hv.m_data,hv.m_size * 0x60);
  }
  Gpu::Device::streamSynchronize();
  PODVector<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>,_std::allocator<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_>_>
  ::~PODVector(&hv);
  return;
}

Assistant:

void
MLCellLinOp::BndryCondLoc::setLOBndryConds (const Geometry& geom, const Real* dx,
                                            const Vector<Array<BCType,AMREX_SPACEDIM> >& lobc,
                                            const Vector<Array<BCType,AMREX_SPACEDIM> >& hibc,
                                            int ratio, const RealVect& interior_bloc,
                                            const Array<Real,AMREX_SPACEDIM>& domain_bloc_lo,
                                            const Array<Real,AMREX_SPACEDIM>& domain_bloc_hi)
{
    const Box& domain = geom.Domain();

#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
    for (MFIter mfi(bcloc); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.validbox();
        for (int icomp = 0; icomp < m_ncomp; ++icomp) {
            RealTuple & bloc  = bcloc[mfi][icomp];
            BCTuple   & bctag = bcond[mfi][icomp];
            MLMGBndry::setBoxBC(bloc, bctag, bx, domain, lobc[icomp], hibc[icomp],
                                dx, ratio, interior_bloc, domain_bloc_lo, domain_bloc_hi,
                                geom.isPeriodicArray());
        }
    }

    Gpu::PinnedVector<GpuArray<BCTL,2*AMREX_SPACEDIM> > hv;
    hv.reserve(bctl_dv.size());
    for (MFIter mfi(bctl); mfi.isValid(); ++mfi)
    {
        for (int icomp = 0; icomp < m_ncomp; ++icomp) {
            GpuArray<BCTL,2*AMREX_SPACEDIM> tmp;
            for (int m = 0; m < 2*AMREX_SPACEDIM; ++m) {
                tmp[m].type = bcond[mfi][icomp][m];
                tmp[m].location = bcloc[mfi][icomp][m];
            }
            hv.push_back(std::move(tmp));
        }
    }
    Gpu::copyAsync(Gpu::hostToDevice, hv.begin(), hv.end(), bctl_dv.begin());
    Gpu::streamSynchronize();
}